

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::ProcessCurrentModule(GraphicsRobustAccessPass *this)

{
  bool bVar1;
  IRContext *this_00;
  anon_class_8_1_8991fb9c local_48;
  undefined1 local_40 [8];
  ProcessFunction fn;
  spv_result_t err;
  GraphicsRobustAccessPass *this_local;
  
  fn._M_invoker._4_4_ = IsCompatibleModule(this);
  this_local._4_4_ = fn._M_invoker._4_4_;
  if (fn._M_invoker._4_4_ == SPV_SUCCESS) {
    local_48.this = this;
    std::function<bool(spvtools::opt::Function*)>::
    function<spvtools::opt::GraphicsRobustAccessPass::ProcessCurrentModule()::__0,void>
              ((function<bool(spvtools::opt::Function*)> *)local_40,&local_48);
    this_00 = Pass::context(&this->super_Pass);
    bVar1 = IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)local_40);
    (this->super_Pass).field_0x34 = ((this->super_Pass).field_0x34 & 1) != 0 || bVar1;
    this_local._4_4_ = SPV_SUCCESS;
    std::function<bool_(spvtools::opt::Function_*)>::~function
              ((function<bool_(spvtools::opt::Function_*)> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t GraphicsRobustAccessPass::ProcessCurrentModule() {
  auto err = IsCompatibleModule();
  if (err != SPV_SUCCESS) return err;

  ProcessFunction fn = [this](opt::Function* f) { return ProcessAFunction(f); };
  module_status_.modified |= context()->ProcessReachableCallTree(fn);

  // Need something here.  It's the price we pay for easier failure paths.
  return SPV_SUCCESS;
}